

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::CharSet<char16_t>::GetNextRange
          (CharSet<char16_t> *this,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  CharBitvec *this_00;
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  char16 cVar4;
  Char CVar5;
  uint n_1;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined4 *puVar10;
  size_t sVar11;
  uint n;
  int iVar12;
  uint uVar13;
  uint index;
  Char tempHighChar;
  Char tempLowChar;
  
  pCVar1 = (this->rep).full.root;
  if (&DAT_00000004 < (undefined1 *)((long)&pCVar1[-1]._vptr_CharSetNode + 7)) {
    if (pCVar1 == (CharSetNode *)0x0) {
      lVar9 = 0;
      iVar6 = 0;
      do {
        iVar6 = iVar6 + POPCOUNT(*(undefined4 *)((long)&this->rep + lVar9 * 4 + 8));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
    }
    else {
      if ((pCVar1 != (CharSetNode *)&CharSetFull::Instance) &&
         (uVar13 = (*pCVar1->_vptr_CharSetNode[0xb])(pCVar1,2), 0xff00 < uVar13)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x252,
                           "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                           ,
                           "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                          );
        if (!bVar3) goto LAB_00e5c01e;
        *puVar10 = 0;
      }
      iVar12 = 0;
      lVar9 = 2;
      do {
        iVar12 = iVar12 + POPCOUNT(*(undefined4 *)((long)&this->rep + lVar9 * 4));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 10);
      pCVar1 = (this->rep).full.root;
      if (pCVar1 == (CharSetNode *)&CharSetFull::Instance) {
        iVar6 = 0xff00;
      }
      else {
        iVar6 = (*pCVar1->_vptr_CharSetNode[0xb])(pCVar1,2);
      }
      iVar6 = iVar6 + iVar12;
    }
  }
  else {
    iVar6 = (int)pCVar1 + -1;
  }
  if (iVar6 == 0) {
    return false;
  }
  if (iVar6 == 1) {
    cVar4 = Singleton(this);
    if ((ushort)cVar4 < (ushort)searchCharStart) {
      return false;
    }
    *outHigherChar = cVar4;
    *outLowerChar = cVar4;
    return true;
  }
  pCVar1 = (this->rep).full.root;
  if ((undefined1 *)((long)&pCVar1[-1]._vptr_CharSetNode + 7U) < (undefined1 *)0x5) {
    Sort(this);
    sVar11 = (this->rep).compact.countPlusOne;
    if (4 < sVar11 - 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x1ef,"(IsCompact())","IsCompact()");
      if (!bVar3) {
LAB_00e5c01e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar10 = 0;
      sVar11 = (this->rep).compact.countPlusOne;
    }
    iVar6 = (int)sVar11;
    uVar13 = iVar6 - 1;
    if (iVar6 == 1) {
      index = 0;
    }
    else {
      index = 0;
      while( true ) {
        uVar7 = GetCompactCharU(this,index);
        CVar5 = (Char)uVar7;
        if ((ushort)searchCharStart <= (ushort)CVar5) break;
        index = index + 1;
        if (uVar13 == index) {
          return false;
        }
      }
      *outHigherChar = CVar5;
      *outLowerChar = CVar5;
    }
    if (index == uVar13) {
      return false;
    }
    uVar7 = index + 1;
    if (uVar7 < uVar13) {
      do {
        uVar8 = GetCompactCharU(this,uVar7);
        if ((ushort)*outHigherChar + 1 != (uVar8 & 0xffff)) {
          return true;
        }
        *outHigherChar = (Char)uVar8;
        iVar12 = uVar7 - iVar6;
        uVar7 = uVar7 + 1;
      } while (iVar12 != -2);
      return true;
    }
    return true;
  }
  if ((ushort)searchCharStart < 0x100) {
    this_00 = &(this->rep).full.direct;
    iVar6 = CharBitvec::NextSet(this_00,(uint)(ushort)searchCharStart);
    if (iVar6 != -1) {
      *outLowerChar = (Char)iVar6;
      iVar6 = CharBitvec::NextClear(this_00,iVar6);
      if (iVar6 != -1) {
        if (0xffff < iVar6 - 1U) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                             ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
          if (!bVar3) goto LAB_00e5c01e;
          *puVar10 = 0;
        }
        *outHigherChar = (Char)(iVar6 - 1U);
        return true;
      }
      *outHigherChar = L'ÿ';
      pCVar1 = (this->rep).full.root;
      if (pCVar1 == (CharSetNode *)0x0) {
        return true;
      }
      iVar6 = (*pCVar1->_vptr_CharSetNode[0xc])(pCVar1,2,(ulong)(ushort)(*outHigherChar + L'\x01'));
      if ((char)iVar6 == '\0') {
        return true;
      }
      if ((ushort)*outHigherChar != 0xffffffff) {
        return true;
      }
      goto LAB_00e5bf39;
    }
  }
  if (pCVar1 == (CharSetNode *)0x0) {
    return false;
  }
  CVar5 = L'Ā';
  if (0x100 < (ushort)searchCharStart) {
    CVar5 = searchCharStart;
  }
  iVar6 = (*pCVar1->_vptr_CharSetNode[0xc])(pCVar1,2,(ulong)(ushort)CVar5);
  if ((char)iVar6 == '\0') {
    return false;
  }
  *outLowerChar = L'\0';
LAB_00e5bf39:
  *outHigherChar = L'\0';
  return true;
}

Assistant:

bool CharSet<char16>::GetNextRange(Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar)
    {
        int count = this->Count();
        if (count == 0)
        {
            return false;
        }
        else if (count == 1)
        {
            Char singleton = this->Singleton();
            if (singleton < searchCharStart)
            {
                return false;
            }

            *outLowerChar = *outHigherChar = singleton;

            return true;
        }

        if (IsCompact())
        {
            this->Sort();
            uint i = 0;
            size_t compactLength = this->GetCompactLength();
            for (; i < compactLength; i++)
            {
                Char nextChar = this->GetCompactChar(i);
                if (nextChar >= searchCharStart)
                {
                    *outLowerChar = *outHigherChar = nextChar;
                    break;
                }
            }

            if (i == compactLength)
            {
                return false;
            }

            i++;

            for (; i < compactLength; i++)
            {
                Char nextChar = this->GetCompactChar(i);
                if (nextChar != *outHigherChar + 1)
                {
                    return true;
                }
                *outHigherChar += 1;
            }

            return true;
        }
        else
        {
            bool found = false;
            if (CTU(searchCharStart) < CharSetNode::directSize)
            {
                int nextSet = rep.full.direct.NextSet(searchCharStart);

                if (nextSet != -1)
                {
                    found = true;

                    *outLowerChar = (char16)nextSet;

                    int nextClear = rep.full.direct.NextClear(nextSet);

                    if (nextClear != -1)
                    {
                        *outHigherChar = UTC(nextClear - 1);
                        return true;
                    }

                    *outHigherChar = CharSetNode::directSize - 1;
                }
            }

            if (rep.full.root == nullptr)
            {
                return found;
            }
            Char tempLowChar = 0, tempHighChar = 0;

            if (found)
            {
                searchCharStart = *outHigherChar + 1;
            }
            else
            {
                searchCharStart = searchCharStart > CharSetNode::directSize ? searchCharStart : CharSetNode::directSize;
            }

            if (rep.full.root->GetNextRange(CharSetNode::levels - 1, searchCharStart, &tempLowChar, &tempHighChar) && (!found || tempLowChar == *outHigherChar + 1))
            {
                if (!found)
                {
                    *outLowerChar = tempLowChar;
                }
                *outHigherChar = tempHighChar;
                return true;
            }

            return found;
        }
    }